

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall
Assimp::Collada::Animation::CombineSingleChannelAnimationsRecursively
          (Animation *this,Animation *pParent)

{
  Animation *pAVar1;
  bool bVar2;
  size_type sVar3;
  reference ppAVar4;
  vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  *this_00;
  reference pvVar5;
  vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_> *this_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  bool local_c9;
  const_iterator local_c0;
  Animation **local_b8;
  Animation *local_b0;
  Animation *anim_1;
  __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_a0;
  iterator it_1;
  _Self local_88;
  _Self local_80 [3];
  Animation *local_68;
  Animation *anim;
  __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_58;
  iterator it;
  undefined1 local_48 [7];
  bool childrenAnimationsHaveDifferentChannels;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childrenTargets;
  Animation *pParent_local;
  Animation *this_local;
  
  childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pParent;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_48);
  it._M_current._7_1_ = 1;
  local_58._M_current =
       (Animation **)
       std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
       begin((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_> *)
             (childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38));
  while( true ) {
    anim = (Animation *)
           std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
           ::end((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                  *)(childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38));
    bVar2 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
                        *)&anim);
    if (!bVar2) break;
    ppAVar4 = __gnu_cxx::
              __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
              ::operator*(&local_58);
    local_68 = *ppAVar4;
    CombineSingleChannelAnimationsRecursively(this,local_68);
    local_c9 = false;
    if ((it._M_current._7_1_ & 1) != 0) {
      sVar3 = std::
              vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
              ::size(&local_68->mChannels);
      local_c9 = false;
      if (sVar3 == 1) {
        pvVar5 = std::
                 vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                 ::operator[](&local_68->mChannels,0);
        local_80[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_48,&pvVar5->mTarget);
        local_88._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
        local_c9 = std::operator==(local_80,&local_88);
      }
    }
    if (local_c9 == false) {
      it._M_current._7_1_ = 0;
    }
    else {
      pvVar5 = std::
               vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               ::operator[](&local_68->mChannels,0);
      pVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48,&pvVar5->mTarget);
      it_1._M_current = (Animation **)pVar6.first._M_node;
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
    ::operator++(&local_58);
  }
  if ((it._M_current._7_1_ & 1) != 0) {
    local_a0._M_current =
         (Animation **)
         std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
         begin((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                *)(childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38));
    while( true ) {
      anim_1 = (Animation *)
               std::
               vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
               end((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                    *)(childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38));
      bVar2 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
                          *)&anim_1);
      if (!bVar2) break;
      ppAVar4 = __gnu_cxx::
                __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
                ::operator*(&local_a0);
      local_b0 = *ppAVar4;
      this_00 = (vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                 *)(childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20);
      pvVar5 = std::
               vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               ::operator[](&local_b0->mChannels,0);
      std::
      vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ::push_back(this_00,pvVar5);
      this_01 = (vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                 *)(childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38);
      __gnu_cxx::
      __normal_iterator<Assimp::Collada::Animation*const*,std::vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>>>
      ::__normal_iterator<Assimp::Collada::Animation**>
                ((__normal_iterator<Assimp::Collada::Animation*const*,std::vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>>>
                  *)&local_c0,&local_a0);
      local_b8 = (Animation **)
                 std::
                 vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                 ::erase(this_01,local_c0);
      pAVar1 = local_b0;
      local_a0._M_current = local_b8;
      if (local_b0 != (Animation *)0x0) {
        ~Animation(local_b0);
        operator_delete(pAVar1,0x50);
      }
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_48);
  return;
}

Assistant:

void CombineSingleChannelAnimationsRecursively(Animation *pParent)
	{
		std::set<std::string> childrenTargets;
		bool childrenAnimationsHaveDifferentChannels = true;

		for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
		{
			Animation *anim = *it;
			CombineSingleChannelAnimationsRecursively(anim);

			if (childrenAnimationsHaveDifferentChannels && anim->mChannels.size() == 1 &&
				childrenTargets.find(anim->mChannels[0].mTarget) == childrenTargets.end()) {
				childrenTargets.insert(anim->mChannels[0].mTarget);
			} else {
				childrenAnimationsHaveDifferentChannels = false;
			}

			++it;
		}

		// We only want to combine animations if they have different channels
		if (childrenAnimationsHaveDifferentChannels)
		{
			for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
			{
				Animation *anim = *it;

				pParent->mChannels.push_back(anim->mChannels[0]);

				it = pParent->mSubAnims.erase(it);

				delete anim;
				continue;
			}
		}
	}